

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

int Cut_ManMappingArea_rec(Cut_Man_t *p,int Node)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  ulong uVar5;
  
  pVVar3 = p->vCutsMax;
  iVar4 = 0;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if ((Node < 0) || (iVar2 = pVVar3->nSize, iVar2 <= Node)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar1 = (uint *)pVVar3->pArray[(uint)Node];
    iVar4 = 0;
    if ((puVar1 != (uint *)0x0) && ((*puVar1 & 0xf0000000) != 0x10000000)) {
      iVar4 = 1;
      if (0xfffffff < *puVar1) {
        uVar5 = 0;
        iVar4 = 0;
        do {
          iVar2 = Cut_ManMappingArea_rec(p,puVar1[uVar5 + 6]);
          iVar4 = iVar4 + iVar2;
          uVar5 = uVar5 + 1;
        } while (uVar5 < *puVar1 >> 0x1c);
        pVVar3 = p->vCutsMax;
        iVar2 = pVVar3->nSize;
        iVar4 = iVar4 + 1;
      }
      if (iVar2 <= Node) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      pVVar3->pArray[(uint)Node] = (void *)0x0;
    }
  }
  return iVar4;
}

Assistant:

int Cut_ManMappingArea_rec( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pCut;
    int i, Counter;
    if ( p->vCutsMax == NULL )
        return 0;
    pCut = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsMax, Node );
    if ( pCut == NULL || pCut->nLeaves == 1 )
        return 0;
    Counter = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        Counter += Cut_ManMappingArea_rec( p, pCut->pLeaves[i] );
    Vec_PtrWriteEntry( p->vCutsMax, Node, NULL );
    return 1 + Counter;
}